

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFGReader.cpp
# Opt level: O0

set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> * __thiscall
CFGReader::cfgs(set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *__return_storage_ptr__,
               CFGReader *this)

{
  const_iterator cVar1;
  const_iterator cVar2;
  iterator __i;
  insert_iterator<std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>_> iVar3;
  CFGReader *this_local;
  set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_> *cfgs;
  
  std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::set(__return_storage_ptr__);
  cVar1 = std::
          map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
          ::begin(&this->m_cfgs);
  cVar2 = std::
          map<unsigned_long,_CFG_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CFG_*>_>_>
          ::end(&this->m_cfgs);
  __i = std::set<CFG_*,_std::less<CFG_*>,_std::allocator<CFG_*>_>::begin(__return_storage_ptr__);
  iVar3 = std::inserter<std::set<CFG*,std::less<CFG*>,std::allocator<CFG*>>>
                    (__return_storage_ptr__,__i);
  std::
  transform<std::_Rb_tree_const_iterator<std::pair<unsigned_long_const,CFG*>>,std::insert_iterator<std::set<CFG*,std::less<CFG*>,std::allocator<CFG*>>>,CFGReader::cfgs()const::__0>
            (cVar1._M_node,cVar2._M_node,iVar3.container,iVar3.iter._M_node._M_node);
  return __return_storage_ptr__;
}

Assistant:

std::set<CFG*> CFGReader::cfgs() const {
	std::set<CFG*> cfgs;

	std::transform(m_cfgs.begin(), m_cfgs.end(),
		std::inserter(cfgs, cfgs.begin()),
		[](const std::map<Addr, CFG*>::value_type &pair) {
			return pair.second;
		}
	);

	return cfgs;
}